

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vision.c
# Opt level: O1

void vision_init(void)

{
  char (*pacVar1) [80];
  char (*paacVar2) [21] [80];
  long lVar3;
  
  pacVar1 = viz_clear;
  paacVar2 = could_see;
  lVar3 = 0;
  do {
    *(char (**) [21] [80])((long)cs_rows0 + lVar3) = paacVar2;
    *(char (**) [21] [80])((long)cs_rows1 + lVar3) = (char (*) [21] [80])((long)paacVar2 + 0x690);
    *(char (**) [80])((long)viz_clear_rows + lVar3) = pacVar1;
    lVar3 = lVar3 + 8;
    pacVar1 = pacVar1 + 1;
    paacVar2 = (char (*) [21] [80])((long)paacVar2 + 0x50);
  } while (lVar3 != 0xa8);
  viz_array = cs_rows0;
  viz_rmin = cs_rmin0;
  viz_rmax = cs_rmax0;
  vision_full_recalc = '\0';
  memset(could_see,0,0xd20);
  return;
}

Assistant:

void vision_init(void)
{
    int i;

    /* Set up the pointers. */
    for (i = 0; i < ROWNO; i++) {
	cs_rows0[i] = could_see[0][i];
	cs_rows1[i] = could_see[1][i];
	viz_clear_rows[i] = viz_clear[i];
    }

    /* Start out with cs0 as our current array */
    viz_array = cs_rows0;
    viz_rmin  = cs_rmin0;
    viz_rmax  = cs_rmax0;

    vision_full_recalc = 0;
    memset(could_see, 0, sizeof(could_see));
}